

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariableForAt(cmCommandArgumentParserHelper *this,char *var)

{
  char *pcVar1;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string ref;
  string local_d8;
  undefined8 local_b8;
  undefined1 *local_b0;
  string local_a8;
  undefined8 local_88;
  char *local_80;
  char local_78 [32];
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 local_48 [32];
  
  if (this->ReplaceAtSyntax == true) {
    pcVar1 = ExpandVariable(this,var);
    bVar2 = pcVar1 == (char *)0x0;
    if ((bVar2) && (this->RemoveEmpty == true)) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      pcVar1 = AddString(this,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return pcVar1;
    }
  }
  local_88 = 1;
  local_78[0] = '@';
  local_80 = local_78;
  local_d8.field_2._M_allocated_capacity = strlen(var);
  local_d8._M_dataplus._M_p = &DAT_00000001;
  local_b0 = local_48;
  local_58 = 1;
  local_48[0] = 0x40;
  local_b8 = 1;
  views._M_len = 3;
  views._M_array = (iterator)&local_d8;
  local_d8._M_string_length = (size_type)local_78;
  local_d8.field_2._8_8_ = var;
  local_50 = local_b0;
  cmCatViews_abi_cxx11_(&local_a8,views);
  pcVar1 = AddString(this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariableForAt(const char* var)
{
  if (this->ReplaceAtSyntax) {
    // try to expand the variable
    const char* ret = this->ExpandVariable(var);
    // if the return was 0 and we want to replace empty strings
    // then return an empty string
    if (!ret && this->RemoveEmpty) {
      return this->AddString("");
    }
    // if the ret was not 0, then return it
    if (ret) {
      return ret;
    }
  }
  // at this point we want to put it back because of one of these cases:
  // - this->ReplaceAtSyntax is false
  // - this->ReplaceAtSyntax is true, but this->RemoveEmpty is false,
  //   and the variable was not defined
  std::string ref = cmStrCat('@', var, '@');
  return this->AddString(ref);
}